

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operations.h
# Opt level: O0

void writeOutput(string *str,string *path)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  ostream *poVar4;
  ulong uVar5;
  long lVar6;
  string *local_ec0;
  string *local_de8;
  string local_de0 [32];
  string local_dc0 [32];
  string local_da0 [8];
  string realstr;
  string local_d80 [36];
  int local_d5c;
  int local_d58;
  int id_1;
  int cur;
  int dsize;
  int origin_size;
  int i;
  File_Block *p;
  int local_d20;
  uint local_d1c;
  int parent_id;
  int local_cf4;
  string local_cf0 [4];
  int id;
  int local_cd0;
  int legal_layers;
  string local_cc0 [36];
  int local_c9c;
  string local_c98 [4];
  int layers;
  string *local_18;
  string *path_local;
  string *str_local;
  
  local_de8 = local_c98;
  local_18 = path;
  path_local = str;
  do {
    std::__cxx11::string::string(local_de8);
    local_de8 = local_de8 + 0x20;
  } while (local_de8 != (string *)&local_18);
  std::__cxx11::string::string(local_cc0,(string *)path);
  iVar1 = parsePath((string *)local_cc0,(string *)local_c98);
  std::__cxx11::string::~string(local_cc0);
  local_c9c = iVar1;
  std::__cxx11::string::string(local_cf0,(string *)path);
  iVar2 = getPathType((string *)local_cf0);
  iVar1 = doesExist((string *)local_c98,iVar1,iVar2 == 2);
  std::__cxx11::string::~string(local_cf0);
  local_cd0 = iVar1;
  pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)str);
  if (*pcVar3 == '\"') {
    std::__cxx11::string::size();
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)str);
    iVar1 = local_c9c;
    if (*pcVar3 != '\"') goto LAB_001049bd;
    if (local_cd0 == local_c9c) {
      std::__cxx11::string::string((string *)&parent_id,(string *)path);
      iVar2 = getPathType((string *)&parent_id);
      iVar1 = getId((string *)local_c98,iVar1,iVar2 == 2);
      std::__cxx11::string::~string((string *)&parent_id);
      local_cf4 = iVar1;
      if (inodes[iVar1].i_mode == 1) {
        setColor(3);
        poVar4 = std::operator<<((ostream *)&std::cout,(string *)path);
        std::operator<<(poVar4," is not a file.\n");
        setColor(2);
        local_d1c = 1;
        goto LAB_00105052;
      }
      iVar1 = local_c9c + -1;
      std::__cxx11::string::string((string *)&p,(string *)path);
      iVar2 = getPathType((string *)&p);
      iVar1 = getId((string *)local_c98,iVar1,iVar2 == 2);
      std::__cxx11::string::~string((string *)&p);
      local_d20 = iVar1;
      _origin_size = getAddressByLocation_File(inodes[local_cf4].i_blocks[0]);
      memset(_origin_size,0,0x1000);
      for (dsize = 1; uVar5 = (ulong)dsize, lVar6 = std::__cxx11::string::size(), uVar5 < lVar6 - 1U
          ; dsize = dsize + 1) {
        pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)str);
        _origin_size->data[dsize + -1] = *pcVar3;
      }
      cur = inodes[local_cf4].i_file_size;
      iVar1 = std::__cxx11::string::size();
      inodes[local_cf4].i_file_size = iVar1 + -2;
      id_1 = cur - inodes[local_cf4].i_file_size;
      for (local_d58 = local_d20; local_d58 != 0; local_d58 = getParentById(local_d58)) {
        inodes[local_d58].i_file_size = inodes[local_d58].i_file_size - id_1;
      }
      inodes[0].i_file_size = inodes[0].i_file_size - id_1;
    }
    else if (local_cd0 + 1 == local_c9c) {
      iVar1 = local_c9c + -1;
      std::__cxx11::string::string(local_d80,(string *)path);
      iVar2 = getPathType((string *)local_d80);
      iVar1 = getId((string *)local_c98,iVar1,iVar2 == 2);
      std::__cxx11::string::~string(local_d80);
      local_d5c = iVar1;
      std::__cxx11::string::size();
      std::__cxx11::string::substr((ulong)local_da0,(ulong)str);
      iVar1 = local_d5c;
      std::__cxx11::string::string(local_dc0,local_c98 + (long)(local_c9c + -1) * 0x20);
      std::__cxx11::string::string(local_de0,local_da0);
      iVar1 = makeFileById(iVar1,(string *)local_dc0,(string *)local_de0);
      std::__cxx11::string::~string(local_de0);
      std::__cxx11::string::~string(local_dc0);
      if (iVar1 == 0) {
        poVar4 = std::operator<<((ostream *)&std::cout,"current folder is full!");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      }
      local_d1c = (uint)(iVar1 == 0);
      std::__cxx11::string::~string(local_da0);
      if (local_d1c != 0) goto LAB_00105052;
    }
    else {
      setColor(3);
      poVar4 = std::operator<<((ostream *)&std::cout,"Invalid path.");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      setColor(2);
    }
  }
  else {
LAB_001049bd:
    setColor(3);
    poVar4 = std::operator<<((ostream *)&std::cout,"File content is illegal.");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    setColor(2);
  }
  local_d1c = 0;
LAB_00105052:
  local_ec0 = (string *)&local_18;
  do {
    local_ec0 = local_ec0 + -0x20;
    std::__cxx11::string::~string(local_ec0);
  } while (local_ec0 != local_c98);
  return;
}

Assistant:

void writeOutput(string str, string path) {
    string names[100];
    int layers = parsePath(path, names);
    int legal_layers = doesExist(names, layers, getPathType(path) == RELATIVE_PATH);
    if (str[0] != '\"' || str[str.size() - 1] != '\"') {
        setColor(COLOR_ERR);
        cout << "File content is illegal." << endl;
        setColor(COLOR_ORIGIN);
    }
    else if (legal_layers == layers) {
        int id = getId(names, layers, getPathType(path) == RELATIVE_PATH);//找到该路径在inode中的i.id
        if (inodes[id].i_mode == A_FOLDER)
        {
            setColor(COLOR_ERR);
            cout << path << " is not a file.\n";
            setColor(COLOR_ORIGIN);
            return;
        }
        int parent_id = getId(names, layers - 1, getPathType(path) == RELATIVE_PATH);//parent id
        File_Block *p = getAddressByLocation_File(inodes[id].i_blocks[0]);
        memset(p, '\0', sizeof(File_Block));
        for (int i = 1; i < str.size() - 1; i++) {
            p->data[i - 1] = str[i];
        }
        int origin_size = inodes[id].i_file_size;
        inodes[id].i_file_size = (int) (str.size()) - 2;
        int dsize = origin_size - inodes[id].i_file_size;
        int cur = parent_id;
        while (cur)
        {
            inodes[cur].i_file_size -= dsize;
            cur = getParentById(cur);
        }
        inodes[0].i_file_size -= dsize;
    }
    else if (legal_layers + 1 == layers) {
        int id = getId(names, layers - 1, getPathType(path) == RELATIVE_PATH);//找到要创建文件所在目录的inode中的i.id
        string realstr = str.substr(1, str.size() - 2);
        if(makeFileById(id, names[layers - 1], realstr) == 0){
            cout << "current folder is full!" << endl;
            return;
        }
    }
    else {
        setColor(COLOR_ERR);
        cout << "Invalid path." << endl;
        setColor(COLOR_ORIGIN);
    }
}